

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O2

int __thiscall IZDeflate::longest_match(IZDeflate *this,IPos cur_match)

{
  long lVar1;
  uch *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uch *puVar12;
  uint uVar13;
  uint uVar14;
  uch uVar15;
  uint uVar16;
  ulong uVar17;
  uch uVar18;
  
  uVar3 = this->strstart;
  uVar8 = (ulong)uVar3;
  puVar12 = this->window + uVar8;
  uVar7 = (ulong)(int)this->prev_length;
  uVar13 = uVar3 - 0x7efa;
  if (uVar3 < 0x7efa) {
    uVar13 = 0;
  }
  uVar18 = puVar12[uVar7 - 1];
  uVar14 = this->max_chain_length >> 2;
  if (this->prev_length < this->good_match) {
    uVar14 = this->max_chain_length;
  }
  uVar15 = puVar12[uVar7];
  lVar9 = (long)this->extra_lbits + uVar8;
  do {
    uVar17 = (ulong)cur_match;
    puVar2 = this->window + uVar17;
    iVar6 = (int)uVar7;
    if ((((puVar2[iVar6] == uVar15) && (puVar2[(long)iVar6 + -1] == uVar18)) &&
        (*puVar2 == *puVar12)) && (puVar2[1] == this->window[uVar8 + 1])) {
      lVar11 = 0;
      do {
        iVar10 = (int)lVar9;
        iVar4 = (int)lVar11;
        if (*(uch *)(lVar9 + 0x1b0f3 + lVar11) != this->window[lVar11 + uVar17 + 3]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f3;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f4 + lVar11) != this->window[lVar11 + uVar17 + 4]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f4;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f5 + lVar11) != this->window[lVar11 + uVar17 + 5]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f5;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f6 + lVar11) != this->window[lVar11 + uVar17 + 6]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f6;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f7 + lVar11) != this->window[lVar11 + uVar17 + 7]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f7;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f8 + lVar11) != this->window[lVar11 + uVar17 + 8]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f8;
          goto LAB_0017938c;
        }
        if (*(uch *)(lVar9 + 0x1b0f9 + lVar11) != this->window[lVar11 + uVar17 + 9]) {
          iVar10 = iVar4 + iVar10 + 0x1b0f9;
          goto LAB_0017938c;
        }
        lVar1 = lVar11 + 8;
      } while ((lVar11 + 2U < 0xfa) &&
              (lVar5 = lVar11 + uVar17, puVar2 = (uch *)(lVar9 + 0x1b0fa + lVar11), lVar11 = lVar1,
              *puVar2 == this->window[lVar5 + 10]));
      iVar10 = iVar10 + (int)lVar1 + 0x1b0f2;
LAB_0017938c:
      iVar10 = iVar10 - ((int)this + uVar3 + 0x1b1f2);
      uVar16 = iVar10 + 0x102;
      if (iVar6 < (int)uVar16) {
        this->match_start = cur_match;
        if (this->nice_match <= (int)uVar16) {
          return uVar16;
        }
        uVar18 = puVar12[iVar10 + 0x101];
        uVar15 = puVar12[(int)uVar16];
        uVar7 = (ulong)uVar16;
      }
    }
    cur_match = (IPos)this->prev[cur_match & 0x7fff];
    if (cur_match <= uVar13) {
      return (int)uVar7;
    }
    uVar14 = uVar14 - 1;
    if (uVar14 == 0) {
      return (int)uVar7;
    }
  } while( true );
}

Assistant:

int IZDeflate::longest_match(IPos cur_match)
// IPos cur_match;                             /* current match */
{
    unsigned chain_length = max_chain_length; /* max hash chain length */
    uch* scan = window + strstart;            /* current string */
    uch* match;                               /* matched string */
    int len;                                  /* length of current match */
    int best_len = prev_length;               /* best match length so */
    IPos limit = strstart > (IPos)MAX_DIST ? strstart - (IPos)MAX_DIST : NIL;
    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0.
     */

/* The code is optimized for HASH_BITS >= 8 and MAX_MATCH-2 multiple of 16.
 * It is easy to get rid of this optimization if necessary.
 */
#        if HASH_BITS < 8 || MAX_MATCH != 258
error:
    Code too clever
#        endif

#        ifdef UNALIGNED_OK
        /* Compare two bytes at a time. Note: this is not always beneficial.
         * Try with and without -DUNALIGNED_OK to check.
         */
        uch* strend = window + strstart + MAX_MATCH - 1;
    ush scan_start = *(ush*)scan;
    ush scan_end = *(ush*)(scan + best_len - 1);
#        else
    uch* strend = window + strstart + MAX_MATCH;
    uch scan_end1 = scan[best_len - 1];
    uch scan_end = scan[best_len];
#        endif

    /* Do not waste too much time if we already have a good match: */
    if (prev_length >= good_match) {
        chain_length >>= 2;
    }

    Assert(strstart <= window_size - MIN_LOOKAHEAD, "insufficient lookahead");

    do {
        Assert(cur_match < strstart, "no future");
        match = window + cur_match;

        /* Skip to next match if the match length cannot increase
         * or if the match length is less than 2:
         */
#        if (defined(UNALIGNED_OK) && MAX_MATCH == 258)
        /* This code assumes sizeof(unsigned short) == 2. Do not use
         * UNALIGNED_OK if your compiler uses a different size.
         */
        if (*(ush*)(match + best_len - 1) != scan_end ||
            *(ush*)match != scan_start)
            continue;

        /* It is not necessary to compare scan[2] and match[2] since they are
         * always equal when the other bytes match, given that the hash keys
         * are equal and that HASH_BITS >= 8. Compare 2 bytes at a time at
         * strstart+3, +5, ... up to strstart+257. We check for insufficient
         * lookahead only every 4th comparison; the 128th check will be made
         * at strstart+257. If MAX_MATCH-2 is not a multiple of 8, it is
         * necessary to put more guard bytes at the end of the window, or
         * to check more often for insufficient lookahead.
         */
        scan++, match++;
        do {
        } while (*(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) && scan < strend);
        /* The funny "do {}" generates better code on most compilers */

        /* Here, scan <= window+strstart+257 */
        Assert(scan <= window + (unsigned)(window_size - 1), "wild scan");
        if (*scan == *match) scan++;

        len = (MAX_MATCH - 1) - (int)(strend - scan);
        scan = strend - (MAX_MATCH - 1);

#        else /* UNALIGNED_OK */

        if (match[best_len] != scan_end || match[best_len - 1] != scan_end1 ||
            *match != *scan || *++match != scan[1])
            continue;

        /* The check at best_len-1 can be removed because it will be made
         * again later. (This heuristic is not always a win.)
         * It is not necessary to compare scan[2] and match[2] since they
         * are always equal when the other bytes match, given that
         * the hash keys are equal and that HASH_BITS >= 8.
         */
        scan += 2, match++;

        /* We check for insufficient lookahead only every 8th comparison;
         * the 256th check will be made at strstart+258.
         */
        do {
            // TODO: Vectorize?
        } while (*++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match && scan < strend);

        Assert(scan <= window + (unsigned)(window_size - 1), "wild scan");

        len = MAX_MATCH - (int)(strend - scan);
        scan = strend - MAX_MATCH;

#        endif /* UNALIGNED_OK */

        if (len > best_len) {
            match_start = cur_match;
            best_len = len;
            if (len >= nice_match) break;
#        ifdef UNALIGNED_OK
            scan_end = *(ush*)(scan + best_len - 1);
#        else
            scan_end1 = scan[best_len - 1];
            scan_end = scan[best_len];
#        endif
        }
    } while ((cur_match = prev[cur_match & WMASK]) > limit &&
             --chain_length != 0);

    return best_len;
}